

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::interval_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>>
               (string_t *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ValidityMask *mask_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  ValidityMask *pVVar6;
  void *pvVar7;
  ulong uVar8;
  ValidityMask *pVVar9;
  interval_t iVar10;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar3 = 8;
    pvVar7 = dataptr;
    for (pVVar6 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar6;
        pVVar6 = (ValidityMask *)
                 ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      input.value.pointer.ptr = (char *)result_mask;
      input.value._0_8_ = *(undefined8 *)((long)&ldata->value + lVar3);
      iVar10 = VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
               Operation<duckdb::string_t,duckdb::interval_t>
                         (*(VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> **)
                           ((long)ldata + lVar3 + -8),input,pVVar6,(idx_t)dataptr,pvVar7);
      *(long *)((long)result_data + lVar3 + -8) = iVar10._0_8_;
      *(int64_t *)((long)&result_data->months + lVar3) = iVar10.micros;
      lVar3 = lVar3 + 0x10;
    }
  }
  else {
    pvVar7 = dataptr;
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    pVVar6 = (ValidityMask *)0x0;
    for (uVar2 = 0; uVar2 != count + 0x3f >> 6; uVar2 = uVar2 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        pVVar9 = pVVar6 + 2;
        if (count <= pVVar6 + 2) {
          pVVar9 = (ValidityMask *)count;
        }
LAB_013cb358:
        uVar4 = (long)pVVar6 << 4 | 8;
        for (; mask_00 = pVVar6, pVVar6 < pVVar9;
            pVVar6 = (ValidityMask *)
                     ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
            ) {
          input_00.value.pointer.ptr = (char *)result_mask;
          input_00.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar4);
          iVar10 = VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
                   Operation<duckdb::string_t,duckdb::interval_t>
                             (*(VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> **)
                               ((long)ldata + (uVar4 - 8)),input_00,pVVar6,(idx_t)dataptr,pvVar7);
          *(long *)((long)result_data + (uVar4 - 8)) = iVar10._0_8_;
          *(int64_t *)((long)&result_data->months + uVar4) = iVar10.micros;
          uVar4 = uVar4 + 0x10;
        }
      }
      else {
        uVar4 = puVar1[uVar2];
        pVVar9 = pVVar6 + 2;
        if (count <= pVVar6 + 2) {
          pVVar9 = (ValidityMask *)count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_013cb358;
        mask_00 = pVVar9;
        if (uVar4 != 0) {
          uVar5 = (long)pVVar6 << 4 | 8;
          for (uVar8 = 0;
              mask_00 = (ValidityMask *)
                        ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                        uVar8), mask_00 < pVVar9; uVar8 = uVar8 + 1) {
            if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
              input_01.value.pointer.ptr = (char *)result_mask;
              input_01.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar5);
              iVar10 = VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
                       Operation<duckdb::string_t,duckdb::interval_t>
                                 (*(VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> **)
                                   ((long)ldata + (uVar5 - 8)),input_01,mask_00,(idx_t)dataptr,
                                  pvVar7);
              *(long *)((long)result_data + (uVar5 - 8)) = iVar10._0_8_;
              *(int64_t *)((long)&result_data->months + uVar5) = iVar10.micros;
            }
            uVar5 = uVar5 + 0x10;
          }
        }
      }
      pVVar6 = mask_00;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}